

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instanceid.c
# Opt level: O0

LY_ERR lyplg_type_dup_node_instanceid(ly_ctx *ctx,lyd_value *original,lyd_value *dup)

{
  LY_ERR local_2c;
  LY_ERR ret;
  lyd_value *dup_local;
  lyd_value *original_local;
  ly_ctx *ctx_local;
  
  memset(dup,0,0x28);
  local_2c = lydict_insert(ctx,original->_canonical,0,&dup->_canonical);
  if ((local_2c == LY_SUCCESS) &&
     (((original->field_2).dec64 == 0 ||
      (local_2c = ly_path_dup(ctx,(original->field_2).target,&(dup->field_2).target),
      local_2c == LY_SUCCESS)))) {
    dup->realtype = original->realtype;
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    lyplg_type_free_instanceid(ctx,dup);
    ctx_local._4_4_ = local_2c;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lyplg_type_dup_node_instanceid(const struct ly_ctx *ctx, const struct lyd_value *original, struct lyd_value *dup)
{
    LY_ERR ret;

    memset(dup, 0, sizeof *dup);

    /* canonical value */
    ret = lydict_insert(ctx, original->_canonical, 0, &dup->_canonical);
    LY_CHECK_GOTO(ret, error);

    if (original->target) {
        /* copy path */
        ret = ly_path_dup(ctx, original->target, &dup->target);
        LY_CHECK_GOTO(ret, error);
    } /* else is the special path "/" that has no target stored */

    dup->realtype = original->realtype;
    return LY_SUCCESS;

error:
    lyplg_type_free_instanceid(ctx, dup);
    return ret;
}